

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

int slang::editDistance(string_view left,string_view right,bool allowReplacements,int maxDistance)

{
  char cVar1;
  int iVar2;
  size_type sVar3;
  reference piVar4;
  const_reference pvVar5;
  reference piVar6;
  int *piVar7;
  int local_11c;
  int local_118;
  int local_114;
  size_type sStack_110;
  int old;
  size_t x;
  int prev;
  int best;
  size_t y;
  int local_e8 [2];
  int i;
  SmallVector<int,_32UL> row;
  size_t n;
  size_t m;
  int maxDistance_local;
  bool allowReplacements_local;
  string_view right_local;
  string_view left_local;
  
  right_local._M_str = (char *)left._M_len;
  right_local._M_len = (size_t)right._M_str;
  _maxDistance_local = right._M_len;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&right_local._M_str);
  row._144_8_ = std::basic_string_view<char,_std::char_traits<char>_>::size
                          ((basic_string_view<char,_std::char_traits<char>_> *)&maxDistance_local);
  SmallVector<int,_32UL>::SmallVector((SmallVector<int,_32UL> *)&i,row._144_8_);
  for (local_e8[0] = 0; local_e8[0] <= row._144_4_; local_e8[0] = local_e8[0] + 1) {
    SmallVectorBase<int>::push_back((SmallVectorBase<int> *)&i,local_e8);
  }
  _prev = 1;
  do {
    if (sVar3 < _prev) {
      piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,row._144_8_);
      left_local._M_str._4_4_ = *piVar4;
LAB_002a9858:
      SmallVector<int,_32UL>::~SmallVector((SmallVector<int,_32UL> *)&i);
      return left_local._M_str._4_4_;
    }
    iVar2 = prev;
    piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,0);
    *piVar4 = iVar2;
    piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,0);
    x._4_4_ = *piVar4;
    x._0_4_ = (int)_prev + -1;
    for (sStack_110 = 1; sStack_110 <= (ulong)row._144_8_; sStack_110 = sStack_110 + 1) {
      piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
      iVar2 = (int)x;
      local_114 = *piVar4;
      if (allowReplacements) {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&right_local._M_str,
                            _prev - 1);
        cVar1 = *pvVar5;
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&maxDistance_local,
                            sStack_110 - 1);
        local_118 = iVar2 + (uint)(cVar1 != *pvVar5);
        piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110 - 1);
        piVar6 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
        piVar7 = std::min<int>(piVar4,piVar6);
        local_11c = *piVar7 + 1;
        piVar7 = std::min<int>(&local_118,&local_11c);
        iVar2 = *piVar7;
        piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
        *piVar4 = iVar2;
      }
      else {
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&right_local._M_str,
                            _prev - 1);
        cVar1 = *pvVar5;
        pvVar5 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)&maxDistance_local,
                            sStack_110 - 1);
        iVar2 = (int)x;
        if (cVar1 == *pvVar5) {
          piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
          *piVar4 = iVar2;
        }
        else {
          piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110 - 1);
          piVar6 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
          piVar7 = std::min<int>(piVar4,piVar6);
          iVar2 = *piVar7;
          piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
          *piVar4 = iVar2 + 1;
        }
      }
      x._0_4_ = local_114;
      piVar4 = SmallVectorBase<int>::operator[]((SmallVectorBase<int> *)&i,sStack_110);
      piVar7 = std::min<int>((int *)((long)&x + 4),piVar4);
      x._4_4_ = *piVar7;
    }
    if ((maxDistance != 0) && (maxDistance < x._4_4_)) {
      left_local._M_str._4_4_ = maxDistance + 1;
      goto LAB_002a9858;
    }
    _prev = _prev + 1;
  } while( true );
}

Assistant:

int editDistance(string_view left, string_view right, bool allowReplacements, int maxDistance) {
    // See: http://en.wikipedia.org/wiki/Levenshtein_distance
    size_t m = left.size();
    size_t n = right.size();

    SmallVector<int, 32> row(n, UninitializedTag());
    for (int i = 0; i <= int(n); i++)
        row.push_back(i);

    for (size_t y = 1; y <= m; y++) {
        row[0] = int(y);
        int best = row[0];

        int prev = int(y - 1);
        for (size_t x = 1; x <= n; x++) {
            int old = row[x];
            if (allowReplacements) {
                row[x] = std::min(prev + (left[y - 1] == right[x - 1] ? 0 : 1),
                                  std::min(row[x - 1], row[x]) + 1);
            }
            else {
                if (left[y - 1] == right[x - 1])
                    row[x] = prev;
                else
                    row[x] = std::min(row[x - 1], row[x]) + 1;
            }

            prev = old;
            best = std::min(best, row[x]);
        }

        if (maxDistance && best > maxDistance)
            return maxDistance + 1;
    }

    return row[n];
}